

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

vm_obj_id_t CVmObjFileName::create_from_sfid(int32_t sfid,char *str,size_t len)

{
  vm_obj_id_t obj_id;
  CVmObjFileName *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  this = (CVmObjFileName *)CVmObject::operator_new(0x10,obj_id);
  CVmObjFileName(this,sfid,str,len);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_sfid(VMG_ int32_t sfid,
                                             const char *str, size_t len)
{
    /* allocate the new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjFileName(vmg_ sfid, str, len);

    /* return the new ID */
    return id;
}